

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

bool CoreML::hasCategoricalSequences(Model *model)

{
  Type *pTVar1;
  FeatureType *pFVar2;
  int iVar3;
  ModelDescription *pMVar4;
  
  pMVar4 = model->description_;
  if (pMVar4 == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  if (0 < (pMVar4->input_).super_RepeatedPtrFieldBase.current_size_) {
    iVar3 = 0;
    do {
      pTVar1 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                         (&(pMVar4->input_).super_RepeatedPtrFieldBase,iVar3);
      pFVar2 = pTVar1->type_;
      if (pFVar2 == (FeatureType *)0x0) {
        pFVar2 = (FeatureType *)&Specification::_FeatureType_default_instance_;
      }
      if ((pFVar2->_oneof_case_[0] == 7) &&
         ((((pFVar2->Type_).multiarraytype_)->datatype_ - 1U & 0xfffffffd) == 0)) goto LAB_0026429b;
      pMVar4 = model->description_;
      if (pMVar4 == (ModelDescription *)0x0) {
        pMVar4 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < (pMVar4->input_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar3 = 0;
  if (0 < (pMVar4->output_).super_RepeatedPtrFieldBase.current_size_) {
    do {
      pTVar1 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                         (&(pMVar4->output_).super_RepeatedPtrFieldBase,iVar3);
      pFVar2 = pTVar1->type_;
      if (pFVar2 == (FeatureType *)0x0) {
        pFVar2 = (FeatureType *)&Specification::_FeatureType_default_instance_;
      }
      if ((pFVar2->_oneof_case_[0] == 7) &&
         ((((pFVar2->Type_).multiarraytype_)->datatype_ - 1U & 0xfffffffd) == 0)) goto LAB_0026429b;
      pMVar4 = model->description_;
      if (pMVar4 == (ModelDescription *)0x0) {
        pMVar4 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < (pMVar4->output_).super_RepeatedPtrFieldBase.current_size_);
    iVar3 = 0;
  }
LAB_0026429e:
  return SUB41(iVar3,0);
LAB_0026429b:
  iVar3 = 1;
  goto LAB_0026429e;
}

Assistant:

bool CoreML::hasCategoricalSequences(const Specification::Model& model) {

    for (int i=0; i<model.description().input_size(); i++) {
        auto &feature = model.description().input(i);
        if (feature.type().Type_case() == Specification::FeatureType::kSequenceType) {
            switch (feature.type().sequencetype().Type_case()) {
                case Specification::SequenceFeatureType::kStringType:
                case Specification::SequenceFeatureType::kInt64Type:
                    return true;
                default:
                    break;
            }
        }
    }

    for (int i=0; i<model.description().output_size(); i++) {
        auto &feature = model.description().output(i);
        if (feature.type().Type_case() == Specification::FeatureType::kSequenceType) {
            switch (feature.type().sequencetype().Type_case()) {
                case Specification::SequenceFeatureType::kStringType:
                case Specification::SequenceFeatureType::kInt64Type:
                    return true;
                default:
                    break;
            }
        }
    }

    return false;
}